

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this,Flags resultDisposition)

{
  bool bVar1;
  OfType OVar2;
  bool in_DL;
  string local_40;
  
  bVar1 = this->m_lhs;
  toString_abi_cxx11_(&local_40,(Catch *)(ulong)bVar1,in_DL);
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.lhs);
  OVar2 = ExpressionFailed;
  if (bVar1 != false) {
    OVar2 = Ok;
  }
  (this->m_result).m_data.resultType = OVar2;
  (this->m_result).m_exprComponents.shouldNegate = (bool)((byte)(resultDisposition >> 1) & 1);
  std::__cxx11::string::~string((string *)&local_40);
  return &this->m_result;
}

Assistant:

ExpressionResultBuilder& endExpression( ResultDisposition::Flags resultDisposition ) {
        bool value = m_lhs ? true : false;
        return m_result
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression( resultDisposition );
    }